

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

bool __thiscall
FIX::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  char cVar11;
  
  bVar2 = IsClamped(this);
  if (!bVar2) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x23c,"bool FIX::double_conversion::Bignum::ToHexString(char *, int) const");
  }
  uVar6 = this->used_digits_;
  if ((ulong)uVar6 == 0) {
    if (buffer_size < 2) {
      bVar2 = false;
    }
    else {
      buffer[0] = '0';
      buffer[1] = '\0';
      bVar2 = true;
    }
  }
  else {
    if (((int)uVar6 < 1) || ((this->bigits_).length_ < (int)uVar6)) {
LAB_001670a9:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xca,
                    "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                   );
    }
    uVar7 = (this->bigits_).start_[(ulong)uVar6 - 1];
    if (uVar7 == 0) {
      __assert_fail("number > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x22a,"int FIX::double_conversion::SizeInHexChars(S) [S = unsigned int]");
    }
    iVar4 = (this->exponent_ + uVar6) * 7 + -8;
    do {
      iVar8 = iVar4;
      iVar4 = iVar8 + 1;
      bVar2 = 0xf < uVar7;
      uVar7 = uVar7 >> 4;
    } while (bVar2);
    iVar8 = iVar8 + 2;
    bVar2 = iVar8 < buffer_size;
    if (iVar8 < buffer_size) {
      buffer[iVar8] = '\0';
      if (0 < this->exponent_) {
        iVar8 = 0;
        do {
          builtin_strncpy(buffer + (long)iVar4 + -3,"0000",4);
          builtin_strncpy(buffer + (long)iVar4 + -6,"0000",4);
          iVar4 = iVar4 + -7;
          iVar8 = iVar8 + 1;
        } while (iVar8 < this->exponent_);
      }
      iVar8 = this->used_digits_;
      if (iVar8 < 2) {
        uVar10 = (ulong)(iVar8 - 1);
      }
      else {
        lVar3 = 0;
        do {
          iVar5 = iVar4;
          if ((this->bigits_).length_ <= lVar3) goto LAB_001670a9;
          uVar6 = (this->bigits_).start_[lVar3];
          pcVar9 = buffer + iVar5;
          iVar4 = 0;
          do {
            cVar11 = '7';
            if ((uVar6 & 0xf) < 10) {
              cVar11 = '0';
            }
            *pcVar9 = cVar11 + (char)(uVar6 & 0xf);
            uVar6 = uVar6 >> 4;
            iVar4 = iVar4 + 1;
            pcVar9 = pcVar9 + -1;
          } while (iVar4 != 7);
          lVar3 = lVar3 + 1;
          iVar8 = this->used_digits_;
          uVar10 = (long)iVar8 - 1;
          iVar4 = iVar5 + -7;
        } while (lVar3 < (long)uVar10);
        iVar4 = iVar5 + -7;
      }
      if ((iVar8 < 1) || ((this->bigits_).length_ < iVar8)) goto LAB_001670a9;
      uVar6 = (this->bigits_).start_[uVar10 & 0xffffffff];
      bVar2 = true;
      if (uVar6 != 0) {
        pcVar9 = buffer + iVar4;
        do {
          cVar11 = '7';
          if ((uVar6 & 0xf) < 10) {
            cVar11 = '0';
          }
          *pcVar9 = cVar11 + (char)(uVar6 & 0xf);
          pcVar9 = pcVar9 + -1;
          bVar1 = 0xf < uVar6;
          uVar6 = uVar6 >> 4;
        } while (bVar1);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}